

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::UnitTestOptions::MatchesFilter(string *name_str,char *filter)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  size_type sVar4;
  bool bVar5;
  bool bVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *name_end;
  char *name_begin;
  bool bVar16;
  
  pcVar3 = (name_str->_M_dataplus)._M_p;
  sVar4 = name_str->_M_string_length;
  pcVar1 = pcVar3 + sVar4;
LAB_0010cfa6:
  pcVar7 = strchr(filter,0x3a);
  pcVar9 = pcVar7;
  if (pcVar7 == (char *)0x0) {
    sVar8 = strlen(filter);
    pcVar9 = filter + sVar8;
  }
  bVar16 = pcVar9 <= filter;
  bVar5 = (long)sVar4 < 1 && bVar16;
  pcVar10 = pcVar3;
  pcVar12 = pcVar3;
  pcVar13 = filter;
  bVar6 = (long)sVar4 < 1;
  if ((long)sVar4 < 1 && bVar16) {
    return true;
  }
  do {
    pcVar11 = pcVar10 + 1;
    pcVar15 = pcVar13;
    while (pcVar14 = pcVar15 + 1, !bVar16) {
      cVar2 = *pcVar15;
      if (cVar2 != '*') {
        if (cVar2 == '?') {
          if (!bVar6) goto LAB_0010d052;
        }
        else if ((!bVar6) && (*pcVar10 == cVar2)) goto LAB_0010d052;
        break;
      }
      bVar16 = pcVar9 <= pcVar14;
      filter = pcVar13;
      pcVar12 = pcVar11;
      pcVar13 = pcVar13 + 1;
      pcVar15 = pcVar14;
      if ((bool)(bVar16 & bVar6)) {
        return true;
      }
    }
    if ((pcVar12 <= pcVar3) || (pcVar11 = pcVar12, pcVar14 = filter, pcVar1 < pcVar12)) break;
LAB_0010d052:
    bVar16 = pcVar9 <= pcVar14;
    pcVar10 = pcVar11;
    pcVar13 = pcVar14;
    bVar6 = pcVar1 <= pcVar11;
    if ((bVar16) && (pcVar1 <= pcVar11)) {
      return true;
    }
  } while( true );
  filter = pcVar7 + 1;
  if (pcVar7 == (char *)0x0) {
    return bVar5;
  }
  goto LAB_0010cfa6;
}

Assistant:

bool UnitTestOptions::MatchesFilter(const std::string& name_str,
                                    const char* filter) {
  // The filter is a list of patterns separated by colons (:).
  const char* pattern = filter;
  while (true) {
    // Find the bounds of this pattern.
    const char* const next_sep = strchr(pattern, ':');
    const char* const pattern_end =
        next_sep != nullptr ? next_sep : pattern + strlen(pattern);

    // Check if this pattern matches name_str.
    if (PatternMatchesString(name_str, pattern, pattern_end)) {
      return true;
    }

    // Give up on this pattern. However, if we found a pattern separator (:),
    // advance to the next pattern (skipping over the separator) and restart.
    if (next_sep == nullptr) {
      return false;
    }
    pattern = next_sep + 1;
  }
  return true;
}